

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O0

void remove_room(level *lev,uint roomno)

{
  mkroom *__dest;
  mkroom *__src;
  int iVar1;
  int local_30;
  uint oroomno;
  int j;
  int i;
  mkroom *maxroom;
  mkroom *croom;
  uint roomno_local;
  level *lev_local;
  
  __dest = lev->rooms + roomno;
  iVar1 = lev->nroom + -1;
  lev->nroom = iVar1;
  __src = lev->rooms + iVar1;
  if (__dest != __src) {
    memcpy(__dest,__src,0xd8);
    iVar1 = lev->nroom;
    for (oroomno = (uint)__dest->lx; (int)oroomno <= (int)__dest->hx; oroomno = oroomno + 1) {
      for (local_30 = (int)__dest->ly; local_30 <= __dest->hy; local_30 = local_30 + 1) {
        if ((*(uint *)&lev->locations[(int)oroomno][local_30].field_0x6 >> 0x10 & 0x3f) ==
            iVar1 + 3U) {
          *(uint *)&lev->locations[(int)oroomno][local_30].field_0x6 =
               *(uint *)&lev->locations[(int)oroomno][local_30].field_0x6 & 0xffc0ffff |
               (roomno + 3 & 0x3f) << 0x10;
        }
      }
    }
  }
  __src->hx = -1;
  return;
}

Assistant:

static void remove_room(struct level *lev, unsigned roomno)
{
    struct mkroom *croom = &lev->rooms[roomno];
    struct mkroom *maxroom = &lev->rooms[--lev->nroom];
    int i, j;
    unsigned oroomno;

    if (croom != maxroom) {
	/* since the order in the array only matters for making corridors,
	 * copy the last room over the one being removed on the assumption
	 * that corridors have already been dug. */
	memcpy(croom, (void *)maxroom,
		      sizeof(struct mkroom));

	/* since maxroom moved, update affected level roomno values */
	oroomno = lev->nroom + ROOMOFFSET;
	roomno += ROOMOFFSET;
	for (i = croom->lx; i <= croom->hx; ++i)
	    for (j = croom->ly; j <= croom->hy; ++j) {
		if (lev->locations[i][j].roomno == oroomno)
		    lev->locations[i][j].roomno = roomno;
	    }
    }

    maxroom->hx = -1;			/* just like add_room */
}